

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

double __thiscall
free_format_parser::HMpsFF::getValue(HMpsFF *this,string *word,bool *is_nan,HighsInt id)

{
  char *__nptr;
  undefined1 *in_RDX;
  string *in_RSI;
  double dVar1;
  double value;
  string local_word;
  anon_class_1_0_00000001 dD2e;
  string *in_stack_ffffffffffffff98;
  string *this_00;
  string local_40 [40];
  undefined1 *local_18;
  
  this_00 = local_40;
  local_18 = in_RDX;
  std::__cxx11::string::string(this_00,in_RSI);
  getValue::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_00,in_stack_ffffffffffffff98);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  *local_18 = 0;
  std::__cxx11::string::~string(local_40);
  return dVar1;
}

Assistant:

double HMpsFF::getValue(const std::string& word, bool& is_nan,
                        const HighsInt id) const {
  // Lambda to replace any d or D by E
  auto dD2e = [&](std::string& word) {
    size_t ix = word.find("D");
    if (ix != std::string::npos) {
      word.replace(ix, 1, "E");
    } else {
      ix = word.find("d");
      if (ix != std::string::npos) word.replace(ix, 1, "E");
    }
  };

  std::string local_word = word;
  dD2e(local_word);
  const double value = atof(local_word.c_str());
  is_nan = false;
  //  printf("value(%d) = %g\n", int(id), value);
  //  if (std::isnan(value)) return true;
  //  // atof('nan') yields 0 with some Windows compilers, so try a string
  //  // comparison
  //  std::string lower_word = word;
  //  if (str_tolower(lower_word) == "nan") return true;
  return value;
}